

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

string * optionEntryTypeToString_abi_cxx11_(HighsOptionType type)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"bool",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"HighsInt",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"string",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  return in_RDI;
}

Assistant:

static std::string optionEntryTypeToString(const HighsOptionType type) {
  if (type == HighsOptionType::kBool) {
    return "bool";
  } else if (type == HighsOptionType::kInt) {
    return "HighsInt";
  } else if (type == HighsOptionType::kDouble) {
    return "double";
  } else {
    return "string";
  }
}